

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O0

Property * __thiscall camp::Class::property(Class *this,string *name)

{
  bool bVar1;
  PropertyNotFound *__return_storage_ptr__;
  __shared_ptr_access<camp::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [48];
  PropertyNotFound local_78;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::shared_ptr<camp::Property>,_std::allocator<std::shared_ptr<camp::Property>_>_>_>_>
  local_30;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::shared_ptr<camp::Property>,_std::allocator<std::shared_ptr<camp::Property>_>_>_>_>
  local_28;
  const_iterator it;
  PropertyNameIndex *names;
  string *name_local;
  Class *this_local;
  
  it.node = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::shared_ptr<camp::Property>,_std::allocator<std::shared_ptr<camp::Property>_>_>_>
             *)boost::multi_index::
               multi_index_container<std::shared_ptr<camp::Property>,_boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Class::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Class::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::const_mem_fun<camp::Property,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&camp::Property::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::shared_ptr<camp::Property>_>_>
               ::get<camp::Class::Name>(&this->m_properties);
  local_28.node =
       (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::shared_ptr<camp::Property>,_std::allocator<std::shared_ptr<camp::Property>_>_>_>
        *)boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::const_mem_fun<camp::Property,std::__cxx11::string_const&,&(camp::Property::name()const)>,std::less<std::__cxx11::string_const>,boost::multi_index::detail::nth_layer<2,std::shared_ptr<camp::Property>,boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Class::Id,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Class::Name,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::const_mem_fun<camp::Property,std::__cxx11::string_const&,&(camp::Property::name()const)>,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<std::shared_ptr<camp::Property>>>,boost::mpl::v_item<camp::Class::Name,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::const_mem_fun<camp::Property,std::__cxx11::string_const&,&(camp::Property::name()const)>,std::less<std::__cxx11::string_const>,boost::multi_index::detail::nth_layer<2,std::shared_ptr<camp::Property>,boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Class::Id,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Class::Name,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::const_mem_fun<camp::Property,std::__cxx11::string_const&,&(camp::Property::name()const)>,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<std::shared_ptr<camp::Property>>>,boost::mpl::v_item<camp::Class::Name,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)it.node,name);
  local_30.node =
       (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::shared_ptr<camp::Property>,_std::allocator<std::shared_ptr<camp::Property>_>_>_>
        *)boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::const_mem_fun<camp::Property,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&camp::Property::name>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::multi_index::detail::nth_layer<2,_std::shared_ptr<camp::Property>,_boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Class::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Class::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::const_mem_fun<camp::Property,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&camp::Property::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::shared_ptr<camp::Property>_>_>,_boost::mpl::v_item<camp::Class::Name,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
          ::end(it.node);
  bVar1 = boost::multi_index::detail::operator==(&local_28,&local_30);
  if (!bVar1) {
    this_00 = (__shared_ptr_access<camp::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              boost::multi_index::detail::
              bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::shared_ptr<camp::Property>,_std::allocator<std::shared_ptr<camp::Property>_>_>_>_>
              ::operator*(&local_28);
    peVar2 = std::__shared_ptr_access<camp::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*(this_00);
    return peVar2;
  }
  __return_storage_ptr__ = (PropertyNotFound *)__cxa_allocate_exception(0x48);
  PropertyNotFound::PropertyNotFound(&local_78,name,&this->m_name);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/class.cpp"
             ,&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d0,"const Property &camp::Class::property(const std::string &) const",&local_d1);
  Error::prepare<camp::PropertyNotFound>
            (__return_storage_ptr__,&local_78,(string *)local_a8,0x80,(string *)local_d0);
  __cxa_throw(__return_storage_ptr__,&PropertyNotFound::typeinfo,PropertyNotFound::~PropertyNotFound
             );
}

Assistant:

const Property& Class::property(const std::string& name) const
{
    const PropertyNameIndex& names = m_properties.get<Name>();

    PropertyNameIndex::const_iterator it = names.find(name);
    if (it == names.end())
        CAMP_ERROR(PropertyNotFound(name, m_name));

    return **it;
}